

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelTransformers.cpp
# Opt level: O0

void iDynTree::reducedModelAddAdditionalFrames
               (Model *fullModel,Model *reducedModel,string *linkInReducedModel,
               Traversal *linkSubModel,FreeFloatingPos *pos,LinkPositions *subModelBase_X_link,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>_>_>
               *newLink_H_oldLink,bool includeAllAdditionalFrames,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *allowedAdditionalFrames)

{
  uint uVar1;
  uint uVar2;
  Transform *pTVar3;
  reference pvVar4;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *pvVar5;
  reference pvVar6;
  string *in_RDX;
  Traversal *in_RSI;
  FreeFloatingPos *in_R8;
  byte in_stack_00000010;
  Transform subModelBase_H_additionalFrame_1;
  Transform subModelBase_H_visitedLink;
  Transform visitedLink_H_additionalFrame;
  string additionalFrameName_1;
  FrameIndex additionalFrame;
  size_t i;
  Transform subModelBase_H_additionalFrame;
  string additionalFrameName;
  LinkIndex visitedLinkIndex;
  LinkConstPtr parentLink;
  LinkConstPtr visitedLink;
  uint traversalEl;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  link2additionalFramesAdjacencyList;
  TraversalIndex in_stack_fffffffffffffcc8;
  Traversal *in_stack_fffffffffffffcd0;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *in_stack_fffffffffffffce0;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *in_stack_fffffffffffffce8;
  Model *in_stack_fffffffffffffcf0;
  string local_2c8 [32];
  string local_2a8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd77;
  Transform *in_stack_fffffffffffffd78;
  string *in_stack_fffffffffffffd80;
  string *in_stack_fffffffffffffd88;
  Model *in_stack_fffffffffffffd90;
  Transform local_228 [120];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>_>_>
  *in_stack_fffffffffffffe50;
  LinkPositions *in_stack_fffffffffffffe58;
  JointPosDoubleArray *in_stack_fffffffffffffe60;
  Traversal *in_stack_fffffffffffffe68;
  Model *in_stack_fffffffffffffe70;
  string local_168 [32];
  value_type local_148;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *local_140;
  string local_138 [8];
  FrameIndex in_stack_fffffffffffffed0;
  Model *in_stack_fffffffffffffed8;
  string local_118 [32];
  Transform local_f8 [96];
  string local_98 [32];
  size_type local_78;
  Link *local_70;
  Link *local_68;
  uint local_60;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_50;
  byte local_31;
  Traversal *local_10;
  
  local_31 = in_stack_00000010 & 1;
  local_10 = in_RSI;
  FreeFloatingPos::jointPos(in_R8);
  computeTransformToTraversalBaseWithAdditionalTransform
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
             in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)0x458fc7);
  buildLinkToAdditionalFramesList(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  local_60 = 0;
  while( true ) {
    uVar1 = local_60;
    uVar2 = Traversal::getNrOfVisitedLinks((Traversal *)0x458ffe);
    if (uVar2 <= uVar1) break;
    local_68 = Traversal::getLink(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    local_70 = Traversal::getParentLink(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    local_78 = Link::getIndex(local_68);
    if (local_70 != (Link *)0x0) {
      Model::getFrameName_abi_cxx11_(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      pTVar3 = LinkPositions::operator()
                         ((LinkPositions *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      iDynTree::Transform::Transform(local_f8,pTVar3);
      std::__cxx11::string::string(local_118,in_RDX);
      std::__cxx11::string::string(local_138,local_98);
      addAdditionalFrameIfAllowed
                (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                 in_stack_fffffffffffffd78,(bool)in_stack_fffffffffffffd77,in_stack_fffffffffffffd68
                );
      std::__cxx11::string::~string(local_138);
      std::__cxx11::string::~string(local_118);
      std::__cxx11::string::~string(local_98);
    }
    local_140 = (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)0x0;
    while( true ) {
      in_stack_fffffffffffffce0 = local_140;
      pvVar4 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[](&local_50,local_78);
      pvVar5 = (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                *)std::vector<long,_std::allocator<long>_>::size(pvVar4);
      if (pvVar5 <= in_stack_fffffffffffffce0) break;
      pvVar4 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[](&local_50,local_78);
      pvVar6 = std::vector<long,_std::allocator<long>_>::operator[](pvVar4,(size_type)local_140);
      local_148 = *pvVar6;
      Model::getFrameName_abi_cxx11_(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      Model::getFrameTransform(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      pTVar3 = LinkPositions::operator()
                         ((LinkPositions *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      iDynTree::Transform::Transform(local_228,pTVar3);
      iDynTree::Transform::operator*((Transform *)&stack0xfffffffffffffd78,local_228);
      in_stack_fffffffffffffcd0 = local_10;
      std::__cxx11::string::string(local_2a8,in_RDX);
      std::__cxx11::string::string(local_2c8,local_168);
      addAdditionalFrameIfAllowed
                (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                 in_stack_fffffffffffffd78,(bool)in_stack_fffffffffffffd77,in_stack_fffffffffffffd68
                );
      std::__cxx11::string::~string(local_2c8);
      std::__cxx11::string::~string(local_2a8);
      std::__cxx11::string::~string(local_168);
      local_140 = (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   *)((long)&(local_140->
                             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1);
    }
    local_60 = local_60 + 1;
  }
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector(in_stack_fffffffffffffce0);
  return;
}

Assistant:

void reducedModelAddAdditionalFrames(const Model& fullModel,
                                           Model& reducedModel,
                                     const std::string linkInReducedModel,
                                     const Traversal& linkSubModel,
                                     const FreeFloatingPos& pos,
                                           LinkPositions& subModelBase_X_link,
                                     const std::unordered_map<std::string, iDynTree::Transform>& newLink_H_oldLink,
                                     bool includeAllAdditionalFrames,
                                     const std::vector<std::string>& allowedAdditionalFrames)
{
    // First compute the transform between each link in the submodel and the submodel base
    computeTransformToTraversalBaseWithAdditionalTransform(fullModel,linkSubModel,pos.jointPos(),subModelBase_X_link,newLink_H_oldLink);

    // We then need to compute the list of additional frames for each link
    // This is a rather inefficient operation (given how frame information is stored in the Model
    // class) and is duplicated for each submodel, but this function should be called
    // just at configuration time, so this should be ok
    std::vector< std::vector<FrameIndex> > link2additionalFramesAdjacencyList;
    buildLinkToAdditionalFramesList(fullModel,link2additionalFramesAdjacencyList);

    // All the links in the traversal are lumped into the base
    // We then need to add all additional frames (and all the links
    // except for the base) to the model as additional frames of linkInReducedModel
    for(unsigned int traversalEl=0; traversalEl < linkSubModel.getNrOfVisitedLinks(); traversalEl++)
    {
        LinkConstPtr visitedLink = linkSubModel.getLink(traversalEl);
        LinkConstPtr parentLink  = linkSubModel.getParentLink(traversalEl);

        LinkIndex visitedLinkIndex = visitedLink->getIndex();

        // Add the link frame as an additional frame only for link that are not the submodel base
        if( parentLink != 0 )
        {
            std::string additionalFrameName = fullModel.getFrameName(visitedLinkIndex);
            Transform subModelBase_H_additionalFrame = subModelBase_X_link(visitedLinkIndex);

            addAdditionalFrameIfAllowed(reducedModel, linkInReducedModel,
                                        additionalFrameName, subModelBase_H_additionalFrame,
                                        includeAllAdditionalFrames, allowedAdditionalFrames);
        }

        // For all the link of the submodel, transfer their additional frame
        // to the lumped link in the reduced model
        for(size_t i = 0; i < link2additionalFramesAdjacencyList[visitedLinkIndex].size(); i++ )
        {
            FrameIndex additionalFrame = link2additionalFramesAdjacencyList[visitedLinkIndex][i];
            std::string additionalFrameName = fullModel.getFrameName(additionalFrame);

            Transform visitedLink_H_additionalFrame  = fullModel.getFrameTransform(additionalFrame);
            Transform subModelBase_H_visitedLink     = subModelBase_X_link(visitedLinkIndex);
            Transform subModelBase_H_additionalFrame =
                subModelBase_H_visitedLink*visitedLink_H_additionalFrame;

            addAdditionalFrameIfAllowed(reducedModel, linkInReducedModel,
                                        additionalFrameName, subModelBase_H_additionalFrame,
                                        includeAllAdditionalFrames, allowedAdditionalFrames);
        }
    }
}